

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_collect_obj_mon_stats(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_68 [8];
  char s [80];
  wchar_t simtype;
  wchar_t nsim;
  command_conflict *cmd_local;
  
  _Var1 = stats_are_enabled();
  if (_Var1) {
    wVar2 = cmd_get_arg_number((command *)cmd,"quantity",(int *)(s + 0x4c));
    if (wVar2 != L'\0') {
      strnfmt(local_68,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_obj_mon_stats::default_nsim);
      _Var1 = get_string("Number of simulations: ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,(int *)(s + 0x4c));
      if (!_Var1) {
        return;
      }
      if ((int)s._76_4_ < 1) {
        return;
      }
      cmd_set_arg_number((command *)cmd,"quantity",s._76_4_);
    }
    do_cmd_wiz_collect_obj_mon_stats::default_nsim._0_1_ = s[0x4c];
    do_cmd_wiz_collect_obj_mon_stats::default_nsim._1_1_ = s[0x4d];
    do_cmd_wiz_collect_obj_mon_stats::default_nsim._2_1_ = s[0x4e];
    do_cmd_wiz_collect_obj_mon_stats::default_nsim._3_1_ = s[0x4f];
    wVar2 = cmd_get_arg_choice((command *)cmd,"choice",(int *)(s + 0x48));
    if (wVar2 != L'\0') {
      strnfmt(local_68,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_obj_mon_stats::default_simtype);
      _Var1 = get_string("Type of Sim: Diving (1) or Clearing (2) ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,(int *)(s + 0x48));
      if (!_Var1) {
        return;
      }
      if ((int)s._72_4_ < 1) {
        return;
      }
      if (2 < (int)s._72_4_) {
        return;
      }
      if ((s._72_4_ == 2) && (_Var1 = get_check("Regen randarts (warning SLOW)? "), _Var1)) {
        s[0x48] = '\x03';
        s[0x49] = '\0';
        s[0x4a] = '\0';
        s[0x4b] = '\0';
      }
      cmd_set_arg_choice((command *)cmd,"choice",s._72_4_);
    }
    do_cmd_wiz_collect_obj_mon_stats::default_simtype = L'\x02';
    if (s._72_4_ == 1) {
      do_cmd_wiz_collect_obj_mon_stats::default_simtype = L'\x01';
    }
    stats_collect(s._76_4_,s._72_4_);
  }
  return;
}

Assistant:

void do_cmd_wiz_collect_obj_mon_stats(struct command *cmd)
{
	/* Record last-used values to be the default in next run. */
	static int default_nsim = 50;
	static int default_simtype = 1;
	int nsim, simtype;
	char s[80];

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_nsim);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}
	default_nsim = nsim;

	if (cmd_get_arg_choice(cmd, "choice", &simtype) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_simtype);

		if (!get_string("Type of Sim: Diving (1) or Clearing (2) ",
			s, sizeof(s))) return;
		if (!get_int_from_string(s, &simtype) || simtype < 1 ||
			simtype > 2) return;
		if (simtype == 2) {
			if (get_check("Regen randarts (warning SLOW)? ")) {
				simtype = 3;
			}
		}
		cmd_set_arg_choice(cmd, "choice", simtype);
	}
	default_simtype = (simtype == 1) ? 1 : 2;

	stats_collect(nsim, simtype);
}